

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  long lVar1;
  int *__s;
  char *__s_00;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  sqlite3_vtab *psVar8;
  uint uVar9;
  void *__dest;
  long in_FS_OFFSET;
  bool bVar10;
  int local_5c;
  char *azSchema [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  azSchema[0] = "CREATE TABlE vocab(term, col, doc, cnt)";
  azSchema[1] = "CREATE TABlE vocab(term, doc, cnt)";
  azSchema[2] = "CREATE TABlE vocab(term, doc, col, offset)";
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar3 = strlen((char *)__s);
    if (sVar3 != 4) goto LAB_001d7cd6;
    bVar10 = *__s == 0x706d6574;
  }
  else {
LAB_001d7cd6:
    bVar10 = false;
  }
  if (argc != 5 && bVar10 == false) {
    psVar8 = (sqlite3_vtab *)0x0;
    pcVar6 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar6;
    local_5c = 1;
    goto LAB_001d7e9e;
  }
  pcVar6 = argv[(ulong)bVar10 + 3];
  pcVar5 = argv[(ulong)bVar10 + 4];
  __s_00 = argv[(ulong)bVar10 * 2 + 1];
  sVar3 = strlen(__s_00);
  sVar4 = strlen(pcVar6);
  local_5c = 0;
  pcVar5 = sqlite3Fts5Strndup(&local_5c,pcVar5,-1);
  if (local_5c == 0) {
    sqlite3Fts5Dequote(pcVar5);
    iVar2 = sqlite3_stricmp(pcVar5,"col");
    if (iVar2 == 0) {
      uVar9 = 0;
LAB_001d7de5:
      iVar2 = 0;
      bVar10 = true;
    }
    else {
      iVar2 = sqlite3_stricmp(pcVar5,"row");
      if (iVar2 == 0) {
        uVar9 = 1;
        goto LAB_001d7de5;
      }
      iVar2 = sqlite3_stricmp(pcVar5,"instance");
      if (iVar2 == 0) {
        uVar9 = 2;
        goto LAB_001d7de5;
      }
      uVar9 = 0;
      pcVar7 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",pcVar5);
      *pzErr = pcVar7;
      iVar2 = 1;
      bVar10 = false;
    }
    sqlite3_free(pcVar5);
    local_5c = iVar2;
    if (bVar10) {
      local_5c = sqlite3_declare_vtab(db,azSchema[uVar9]);
    }
  }
  else {
    uVar9 = 0;
  }
  psVar8 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_5c,(long)((int)sVar3 + (int)sVar4 + 0x42));
  if (psVar8 == (sqlite3_vtab *)0x0) {
    psVar8 = (sqlite3_vtab *)0x0;
  }
  else {
    sVar4 = (size_t)((int)sVar4 + 1);
    psVar8[2].pModule = (sqlite3_module *)pAux;
    psVar8[2].nRef = uVar9;
    psVar8[1].zErrMsg = (char *)db;
    psVar8[1].pModule = (sqlite3_module *)&psVar8[2].zErrMsg;
    __dest = (void *)((long)&psVar8[2].zErrMsg + sVar4);
    *(void **)&psVar8[1].nRef = __dest;
    memcpy(&psVar8[2].zErrMsg,pcVar6,sVar4);
    memcpy(__dest,__s_00,(long)((int)sVar3 + 1));
    sqlite3Fts5Dequote((char *)psVar8[1].pModule);
    sqlite3Fts5Dequote(*(char **)&psVar8[1].nRef);
  }
LAB_001d7e9e:
  *ppVTab = psVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_5c;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = {
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1;
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;

    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}